

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# age.cpp
# Opt level: O2

void duckdb::AgeFunctionStandard(DataChunk *input,ExpressionState *state,Vector *result)

{
  idx_t count;
  interval_t *piVar1;
  unsigned_long *puVar2;
  data_ptr_t pdVar3;
  ulong uVar4;
  data_ptr_t pdVar5;
  date_t date;
  ClientContext *context;
  MetaTransaction *pMVar6;
  reference vector;
  idx_t iVar7;
  ulong idx;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong idx_00;
  int64_t *piVar11;
  ValidityMask *pVVar12;
  idx_t iVar13;
  interval_t iVar14;
  timestamp_t *local_b8;
  ValidityMask *local_b0;
  ValidityMask *local_a8;
  data_ptr_t local_a0;
  ulong local_98;
  ulong local_90;
  data_ptr_t local_88;
  timestamp_t current_date;
  UnifiedVectorFormat local_78;
  
  context = ExpressionState::GetContext(state);
  pMVar6 = MetaTransaction::Get(context);
  date = Timestamp::GetDate((timestamp_t)(pMVar6->start_timestamp).value);
  current_date = Timestamp::FromDatetime(date,(dtime_t)0x0);
  vector = vector<duckdb::Vector,_true>::get<true>(&input->data,0);
  count = input->count;
  local_b8 = &current_date;
  if (vector->vector_type == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar5 = result->data;
    pdVar3 = vector->data;
    FlatVector::VerifyFlatVector(vector);
    FlatVector::VerifyFlatVector(result);
    local_a8 = &result->validity;
    if ((vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      piVar11 = (int64_t *)(pdVar5 + 8);
      for (iVar13 = 0; count != iVar13; iVar13 = iVar13 + 1) {
        iVar14 = UnaryLambdaWrapperWithNulls::
                 Operation<duckdb::AgeFunctionStandard(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::timestamp_t,duckdb::interval_t>
                           ((timestamp_t)*(int64_t *)(pdVar3 + iVar13 * 8),local_a8,iVar13,&local_b8
                           );
        piVar11[-1] = iVar14._0_8_;
        *piVar11 = iVar14.micros;
        piVar11 = piVar11 + 2;
      }
    }
    else {
      TemplatedValidityMask<unsigned_long>::Copy
                (&local_a8->super_TemplatedValidityMask<unsigned_long>,
                 &(vector->validity).super_TemplatedValidityMask<unsigned_long>,count);
      local_90 = count + 0x3f >> 6;
      local_a0 = pdVar5 + 8;
      idx_00 = 0;
      local_b0 = &vector->validity;
      for (uVar10 = 0; pVVar12 = local_a8, uVar10 != local_90; uVar10 = uVar10 + 1) {
        puVar2 = (local_b0->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          uVar8 = idx_00 + 0x40;
          if (count <= idx_00 + 0x40) {
            uVar8 = count;
          }
LAB_00c46f7e:
          piVar11 = (int64_t *)(local_a0 + idx_00 * 0x10);
          for (; idx = idx_00, idx_00 < uVar8; idx_00 = idx_00 + 1) {
            iVar14 = UnaryLambdaWrapperWithNulls::
                     Operation<duckdb::AgeFunctionStandard(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::timestamp_t,duckdb::interval_t>
                               ((timestamp_t)*(int64_t *)(pdVar3 + idx_00 * 8),pVVar12,idx_00,
                                &local_b8);
            piVar11[-1] = iVar14._0_8_;
            *piVar11 = iVar14.micros;
            piVar11 = piVar11 + 2;
          }
        }
        else {
          uVar4 = puVar2[uVar10];
          uVar8 = idx_00 + 0x40;
          if (count <= idx_00 + 0x40) {
            uVar8 = count;
          }
          if (uVar4 == 0xffffffffffffffff) goto LAB_00c46f7e;
          idx = uVar8;
          if (uVar4 != 0) {
            piVar11 = (int64_t *)(local_a0 + idx_00 * 0x10);
            local_88 = pdVar3 + idx_00 * 8;
            local_98 = uVar10;
            for (uVar9 = 0; idx = uVar9 + idx_00, uVar10 = local_98, idx < uVar8; uVar9 = uVar9 + 1)
            {
              if ((uVar4 >> (uVar9 & 0x3f) & 1) != 0) {
                iVar14 = UnaryLambdaWrapperWithNulls::
                         Operation<duckdb::AgeFunctionStandard(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::timestamp_t,duckdb::interval_t>
                                   ((timestamp_t)*(int64_t *)(local_88 + uVar9 * 8),local_a8,idx,
                                    &local_b8);
                piVar11[-1] = iVar14._0_8_;
                *piVar11 = iVar14.micros;
              }
              piVar11 = piVar11 + 2;
            }
          }
        }
        idx_00 = idx;
      }
    }
  }
  else if (vector->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    piVar1 = (interval_t *)result->data;
    piVar11 = (int64_t *)vector->data;
    puVar2 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar2 == (unsigned_long *)0x0) || ((*puVar2 & 1) != 0)) {
      ConstantVector::SetNull(result,false);
      iVar14 = UnaryLambdaWrapperWithNulls::
               Operation<duckdb::AgeFunctionStandard(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::timestamp_t,duckdb::interval_t>
                         ((timestamp_t)*piVar11,&result->validity,0,&local_b8);
      *piVar1 = iVar14;
    }
    else {
      ConstantVector::SetNull(result,true);
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(vector,count,&local_78);
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar5 = result->data;
    FlatVector::VerifyFlatVector(result);
    pVVar12 = &result->validity;
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      piVar11 = (int64_t *)(pdVar5 + 8);
      for (iVar13 = 0; count != iVar13; iVar13 = iVar13 + 1) {
        iVar7 = iVar13;
        if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
          iVar7 = (idx_t)(local_78.sel)->sel_vector[iVar13];
        }
        iVar14 = UnaryLambdaWrapperWithNulls::
                 Operation<duckdb::AgeFunctionStandard(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::timestamp_t,duckdb::interval_t>
                           ((timestamp_t)*(int64_t *)(local_78.data + iVar7 * 8),pVVar12,iVar13,
                            &local_b8);
        piVar11[-1] = iVar14._0_8_;
        *piVar11 = iVar14.micros;
        piVar11 = piVar11 + 2;
      }
    }
    else {
      piVar11 = (int64_t *)(pdVar5 + 8);
      for (iVar13 = 0; count != iVar13; iVar13 = iVar13 + 1) {
        iVar7 = iVar13;
        if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
          iVar7 = (idx_t)(local_78.sel)->sel_vector[iVar13];
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar7 >> 6]
             >> (iVar7 & 0x3f) & 1) == 0) {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&pVVar12->super_TemplatedValidityMask<unsigned_long>,iVar13);
        }
        else {
          iVar14 = UnaryLambdaWrapperWithNulls::
                   Operation<duckdb::AgeFunctionStandard(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::timestamp_t,duckdb::interval_t>
                             ((timestamp_t)*(int64_t *)(local_78.data + iVar7 * 8),pVVar12,iVar13,
                              &local_b8);
          piVar11[-1] = iVar14._0_8_;
          *piVar11 = iVar14.micros;
        }
        piVar11 = piVar11 + 2;
      }
    }
    UnifiedVectorFormat::~UnifiedVectorFormat(&local_78);
  }
  return;
}

Assistant:

static void AgeFunctionStandard(DataChunk &input, ExpressionState &state, Vector &result) {
	D_ASSERT(input.ColumnCount() == 1);
	//	Subtract argument from current_date (at midnight)
	//	Theoretically, this should be TZ-sensitive, but since we have to be able to handle
	//	plain TZ when ICU is not loaded, we implement this in UTC (like everything else)
	//	To get the PG behaviour, we overload these functions in ICU for TSTZ arguments.
	auto current_date = Timestamp::FromDatetime(
	    Timestamp::GetDate(MetaTransaction::Get(state.GetContext()).start_timestamp), dtime_t(0));

	UnaryExecutor::ExecuteWithNulls<timestamp_t, interval_t>(input.data[0], result, input.size(),
	                                                         [&](timestamp_t input, ValidityMask &mask, idx_t idx) {
		                                                         if (Timestamp::IsFinite(input)) {
			                                                         return Interval::GetAge(current_date, input);
		                                                         } else {
			                                                         mask.SetInvalid(idx);
			                                                         return interval_t();
		                                                         }
	                                                         });
}